

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

char * jsonnet_evaluate_file_aux(JsonnetVm *vm,char *filename,int *error,EvalKind kind)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string sStack_3d8;
  string input;
  ifstream f;
  int aiStack_210 [50];
  undefined8 auStack_148 [36];
  
  std::ifstream::ifstream(&f);
  std::ifstream::open((char *)&f,(_Ios_Openmode)filename);
  if (*(int *)((long)aiStack_210 + *(long *)(_f + -0x18)) == 0) {
    input._M_dataplus._M_p = (pointer)&input.field_2;
    input._M_string_length = 0;
    input.field_2._M_local_buf[0] = '\0';
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)((long)auStack_148 + *(long *)(_f + -0x18));
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)&input,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
    pcVar3 = jsonnet_evaluate_snippet_aux(vm,filename,input._M_dataplus._M_p,error,kind);
    std::__cxx11::string::~string((string *)&input);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&input);
    poVar1 = std::operator<<((ostream *)input.field_2._M_local_buf,"Opening input file: ");
    poVar1 = std::operator<<(poVar1,filename);
    poVar1 = std::operator<<(poVar1,": ");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    std::operator<<(poVar1,pcVar3);
    *error = 1;
    std::__cxx11::stringbuf::str();
    pcVar3 = from_string(vm,&sStack_3d8);
    std::__cxx11::string::~string((string *)&sStack_3d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&input);
  }
  std::ifstream::~ifstream(&f);
  return pcVar3;
}

Assistant:

static char *jsonnet_evaluate_file_aux(JsonnetVm *vm, const char *filename, int *error,
                                       EvalKind kind)
{
    std::ifstream f;
    f.open(filename);
    if (!f.good()) {
        std::stringstream ss;
        ss << "Opening input file: " << filename << ": " << strerror(errno);
        *error = true;
        return from_string(vm, ss.str());
    }
    std::string input;
    input.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());

    return jsonnet_evaluate_snippet_aux(vm, filename, input.c_str(), error, kind);
}